

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

void bson_iter_dbpointer(bson_iter_t *iter,uint32_t *collection_len,char **collection,
                        bson_oid_t **oid)

{
  bson_oid_t **oid_local;
  char **collection_local;
  uint32_t *collection_len_local;
  bson_iter_t *iter_local;
  
  if (iter != (bson_iter_t *)0x0) {
    if (collection != (char **)0x0) {
      *collection = (char *)0x0;
    }
    if (oid != (bson_oid_t **)0x0) {
      *oid = (bson_oid_t *)0x0;
    }
    if (iter->raw[iter->type] == '\f') {
      if (collection_len != (uint32_t *)0x0) {
        *collection_len = *(uint32_t *)(iter->raw + iter->d1);
        *collection_len = *collection_len;
        if (*collection_len != 0) {
          *collection_len = *collection_len - 1;
        }
      }
      if (collection != (char **)0x0) {
        *collection = (char *)(iter->raw + iter->d2);
      }
      if (oid != (bson_oid_t **)0x0) {
        *oid = (bson_oid_t *)(iter->raw + iter->d3);
      }
    }
    return;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x5c6,"bson_iter_dbpointer","iter");
  abort();
}

Assistant:

void
bson_iter_dbpointer (const bson_iter_t *iter,  /* IN */
                     uint32_t *collection_len, /* OUT */
                     const char **collection,  /* OUT */
                     const bson_oid_t **oid)   /* OUT */
{
   BSON_ASSERT (iter);

   if (collection) {
      *collection = NULL;
   }

   if (oid) {
      *oid = NULL;
   }

   if (ITER_TYPE (iter) == BSON_TYPE_DBPOINTER) {
      if (collection_len) {
         memcpy (
            collection_len, (iter->raw + iter->d1), sizeof (*collection_len));
         *collection_len = BSON_UINT32_FROM_LE (*collection_len);

         if ((*collection_len) > 0) {
            (*collection_len)--;
         }
      }

      if (collection) {
         *collection = (const char *) (iter->raw + iter->d2);
      }

      if (oid) {
         *oid = (const bson_oid_t *) (iter->raw + iter->d3);
      }
   }
}